

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O1

string * __thiscall
stackjit::TypeSystem::toString_abi_cxx11_
          (string *__return_storage_ptr__,TypeSystem *this,PrimitiveTypes primitiveType)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "Void";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "Int";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Float";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Bool";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "Char";
    pcVar1 = "";
    break;
  default:
    pcVar1 = "";
    pcVar2 = pcVar1;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string TypeSystem::toString(PrimitiveTypes primitiveType) {
		switch (primitiveType) {
			case PrimitiveTypes::Void:
				return "Void";
			case PrimitiveTypes::Integer:
				return "Int";
			case PrimitiveTypes::Float:
				return "Float";
			case PrimitiveTypes::Bool:
				return "Bool";
			case PrimitiveTypes::Char:
				return "Char";
		}

		return "";
	}